

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easing.cpp
# Opt level: O1

qreal easeOutInExpo(qreal t)

{
  double dVar1;
  qreal qVar2;
  
  qVar2 = 0.5;
  if (0.5 <= t) {
    dVar1 = t + t + -1.0;
    if (((dVar1 != 0.0) || (NAN(dVar1))) && ((dVar1 != 1.0 || (NAN(dVar1))))) {
      dVar1 = exp2((dVar1 + -1.0) * 10.0);
      dVar1 = dVar1 + -0.001;
    }
    qVar2 = dVar1 * 0.5 + 0.5;
  }
  else {
    dVar1 = t + t;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      dVar1 = exp2(dVar1 * -10.0);
      qVar2 = (1.0 - dVar1) * 1.001 * 0.5;
    }
  }
  return qVar2;
}

Assistant:

static qreal easeOutInExpo(qreal t)
{
    if (t < 0.5) return easeOutExpo (2*t)/2;
    return easeInExpo(2*t - 1)/2 + 0.5;
}